

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O1

void ctl_arena_refresh(tsdn_t *tsdn,arena_t *arena,ctl_arena_t *ctl_sdarena,uint i,_Bool destroyed)

{
  uint64_t *puVar1;
  long *plVar2;
  atomic_zu_t *paVar3;
  long *plVar4;
  long *plVar5;
  uint uVar6;
  ctl_arena_stats_t *pcVar7;
  ctl_arena_stats_t *pcVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  ctl_arena_t *pcVar14;
  size_t sVar15;
  uint64_t uVar16;
  long lVar17;
  size_t *psVar18;
  nstime_t *pnVar19;
  nstime_t *pnVar20;
  uint64_t uVar21;
  uint64_t uVar22;
  uint64_t uVar23;
  uint64_t uVar24;
  
  pcVar14 = arenas_i((ulong)i);
  pcVar14->nthreads = 0;
  pcVar14->dss = dss_prec_names[3];
  *(undefined4 *)&pcVar14->dirty_decay_ms = 0xffffffff;
  *(undefined4 *)((long)&pcVar14->dirty_decay_ms + 4) = 0xffffffff;
  *(undefined4 *)&pcVar14->muzzy_decay_ms = 0xffffffff;
  *(undefined4 *)((long)&pcVar14->muzzy_decay_ms + 4) = 0xffffffff;
  pcVar14->pactive = 0;
  pcVar14->pdirty = 0;
  pcVar14->pmuzzy = 0;
  memset(pcVar14->astats,0,0x27a8);
  memset(&pcVar14->astats->allocated_small,0,0x1470);
  memset(pcVar14->astats->lstats,0,0x24c0);
  memset(pcVar14->astats->estats,0,0x2550);
  pcVar7 = pcVar14->astats;
  arena_stats_merge(tsdn,arena,&pcVar14->nthreads,&pcVar14->dss,&pcVar14->dirty_decay_ms,
                    &pcVar14->muzzy_decay_ms,&pcVar14->pactive,&pcVar14->pdirty,&pcVar14->pmuzzy,
                    &pcVar7->astats,pcVar7->bstats,pcVar7->lstats,pcVar7->estats);
  pcVar7 = pcVar14->astats;
  sVar15 = pcVar7->allocated_small;
  uVar21 = pcVar7->nmalloc_small;
  uVar22 = pcVar7->ndalloc_small;
  uVar16 = pcVar7->nrequests_small;
  uVar23 = pcVar7->nfills_small;
  uVar24 = pcVar7->nflushes_small;
  lVar17 = 0x4ff;
  psVar18 = sz_index2size_tab;
  do {
    sVar15 = sVar15 + *psVar18 * *(long *)((long)pcVar7 + lVar17 * 8 + -8);
    pcVar7->allocated_small = sVar15;
    plVar2 = (long *)((long)pcVar7 + lVar17 * 8 + -0x20);
    uVar21 = uVar21 + *plVar2;
    uVar22 = uVar22 + plVar2[1];
    pcVar7->nmalloc_small = uVar21;
    pcVar7->ndalloc_small = uVar22;
    uVar16 = uVar16 + *(long *)((long)pcVar7 + lVar17 * 8 + -0x10);
    pcVar7->nrequests_small = uVar16;
    paVar3 = &(pcVar7->astats).mapped + lVar17;
    uVar23 = uVar23 + paVar3->repr;
    uVar24 = uVar24 + paVar3[1].repr;
    pcVar7->nfills_small = uVar23;
    pcVar7->nflushes_small = uVar24;
    lVar17 = lVar17 + 0x12;
    psVar18 = psVar18 + 1;
  } while (lVar17 != 0x787);
  if (!destroyed) {
    ctl_sdarena->nthreads = ctl_sdarena->nthreads + pcVar14->nthreads;
    sVar15 = pcVar14->pdirty;
    ctl_sdarena->pactive = ctl_sdarena->pactive + pcVar14->pactive;
    ctl_sdarena->pdirty = ctl_sdarena->pdirty + sVar15;
    ctl_sdarena->pmuzzy = ctl_sdarena->pmuzzy + pcVar14->pmuzzy;
  }
  pcVar8 = ctl_sdarena->astats;
  if (!destroyed) {
    (pcVar8->astats).mapped.repr = (pcVar7->astats).mapped.repr + (pcVar8->astats).mapped.repr;
    (pcVar8->astats).retained.repr = (pcVar7->astats).retained.repr + (pcVar8->astats).retained.repr
    ;
    (pcVar8->astats).extent_avail.repr =
         (pcVar7->astats).extent_avail.repr + (pcVar8->astats).extent_avail.repr;
  }
  (pcVar8->astats).decay_dirty.npurge.repr =
       (pcVar7->astats).decay_dirty.npurge.repr + (pcVar8->astats).decay_dirty.npurge.repr;
  (pcVar8->astats).decay_dirty.nmadvise.repr =
       (pcVar7->astats).decay_dirty.nmadvise.repr + (pcVar8->astats).decay_dirty.nmadvise.repr;
  (pcVar8->astats).decay_dirty.purged.repr =
       (pcVar7->astats).decay_dirty.purged.repr + (pcVar8->astats).decay_dirty.purged.repr;
  (pcVar8->astats).decay_muzzy.npurge.repr =
       (pcVar7->astats).decay_muzzy.npurge.repr + (pcVar8->astats).decay_muzzy.npurge.repr;
  (pcVar8->astats).decay_muzzy.nmadvise.repr =
       (pcVar7->astats).decay_muzzy.nmadvise.repr + (pcVar8->astats).decay_muzzy.nmadvise.repr;
  (pcVar8->astats).decay_muzzy.purged.repr =
       (pcVar7->astats).decay_muzzy.purged.repr + (pcVar8->astats).decay_muzzy.purged.repr;
  nstime_add(&(pcVar8->astats).mutex_prof_data[0].tot_wait_time,
             &(pcVar7->astats).mutex_prof_data[0].tot_wait_time);
  pnVar19 = &(pcVar8->astats).mutex_prof_data[0].max_wait_time;
  pnVar20 = &(pcVar7->astats).mutex_prof_data[0].max_wait_time;
  iVar13 = nstime_compare(pnVar19,pnVar20);
  if (iVar13 < 0) {
    nstime_copy(pnVar19,pnVar20);
  }
  uVar16 = (pcVar7->astats).mutex_prof_data[0].n_spin_acquired;
  uVar21 = (pcVar8->astats).mutex_prof_data[0].n_spin_acquired;
  (pcVar8->astats).mutex_prof_data[0].n_wait_times =
       (pcVar8->astats).mutex_prof_data[0].n_wait_times +
       (pcVar7->astats).mutex_prof_data[0].n_wait_times;
  (pcVar8->astats).mutex_prof_data[0].n_spin_acquired = uVar21 + uVar16;
  uVar6 = (pcVar7->astats).mutex_prof_data[0].max_n_thds;
  if ((pcVar8->astats).mutex_prof_data[0].max_n_thds < uVar6) {
    (pcVar8->astats).mutex_prof_data[0].max_n_thds = uVar6;
  }
  (pcVar8->astats).mutex_prof_data[0].n_waiting_thds.repr =
       (pcVar7->astats).mutex_prof_data[0].n_waiting_thds.repr +
       (pcVar8->astats).mutex_prof_data[0].n_waiting_thds.repr;
  puVar1 = &(pcVar8->astats).mutex_prof_data[0].n_owner_switches;
  *puVar1 = *puVar1 + (pcVar7->astats).mutex_prof_data[0].n_owner_switches;
  puVar1 = &(pcVar8->astats).mutex_prof_data[0].n_lock_ops;
  *puVar1 = *puVar1 + (pcVar7->astats).mutex_prof_data[0].n_lock_ops;
  nstime_add(&(pcVar8->astats).mutex_prof_data[1].tot_wait_time,
             &(pcVar7->astats).mutex_prof_data[1].tot_wait_time);
  pnVar19 = &(pcVar8->astats).mutex_prof_data[1].max_wait_time;
  pnVar20 = &(pcVar7->astats).mutex_prof_data[1].max_wait_time;
  iVar13 = nstime_compare(pnVar19,pnVar20);
  if (iVar13 < 0) {
    nstime_copy(pnVar19,pnVar20);
  }
  uVar16 = (pcVar7->astats).mutex_prof_data[1].n_spin_acquired;
  uVar21 = (pcVar8->astats).mutex_prof_data[1].n_spin_acquired;
  (pcVar8->astats).mutex_prof_data[1].n_wait_times =
       (pcVar8->astats).mutex_prof_data[1].n_wait_times +
       (pcVar7->astats).mutex_prof_data[1].n_wait_times;
  (pcVar8->astats).mutex_prof_data[1].n_spin_acquired = uVar21 + uVar16;
  uVar6 = (pcVar7->astats).mutex_prof_data[1].max_n_thds;
  if ((pcVar8->astats).mutex_prof_data[1].max_n_thds < uVar6) {
    (pcVar8->astats).mutex_prof_data[1].max_n_thds = uVar6;
  }
  (pcVar8->astats).mutex_prof_data[1].n_waiting_thds.repr =
       (pcVar7->astats).mutex_prof_data[1].n_waiting_thds.repr +
       (pcVar8->astats).mutex_prof_data[1].n_waiting_thds.repr;
  puVar1 = &(pcVar8->astats).mutex_prof_data[1].n_owner_switches;
  *puVar1 = *puVar1 + (pcVar7->astats).mutex_prof_data[1].n_owner_switches;
  puVar1 = &(pcVar8->astats).mutex_prof_data[1].n_lock_ops;
  *puVar1 = *puVar1 + (pcVar7->astats).mutex_prof_data[1].n_lock_ops;
  nstime_add(&(pcVar8->astats).mutex_prof_data[2].tot_wait_time,
             &(pcVar7->astats).mutex_prof_data[2].tot_wait_time);
  pnVar19 = &(pcVar8->astats).mutex_prof_data[2].max_wait_time;
  pnVar20 = &(pcVar7->astats).mutex_prof_data[2].max_wait_time;
  iVar13 = nstime_compare(pnVar19,pnVar20);
  if (iVar13 < 0) {
    nstime_copy(pnVar19,pnVar20);
  }
  uVar16 = (pcVar7->astats).mutex_prof_data[2].n_spin_acquired;
  uVar21 = (pcVar8->astats).mutex_prof_data[2].n_spin_acquired;
  (pcVar8->astats).mutex_prof_data[2].n_wait_times =
       (pcVar8->astats).mutex_prof_data[2].n_wait_times +
       (pcVar7->astats).mutex_prof_data[2].n_wait_times;
  (pcVar8->astats).mutex_prof_data[2].n_spin_acquired = uVar21 + uVar16;
  uVar6 = (pcVar7->astats).mutex_prof_data[2].max_n_thds;
  if ((pcVar8->astats).mutex_prof_data[2].max_n_thds < uVar6) {
    (pcVar8->astats).mutex_prof_data[2].max_n_thds = uVar6;
  }
  (pcVar8->astats).mutex_prof_data[2].n_waiting_thds.repr =
       (pcVar7->astats).mutex_prof_data[2].n_waiting_thds.repr +
       (pcVar8->astats).mutex_prof_data[2].n_waiting_thds.repr;
  puVar1 = &(pcVar8->astats).mutex_prof_data[2].n_owner_switches;
  *puVar1 = *puVar1 + (pcVar7->astats).mutex_prof_data[2].n_owner_switches;
  puVar1 = &(pcVar8->astats).mutex_prof_data[2].n_lock_ops;
  *puVar1 = *puVar1 + (pcVar7->astats).mutex_prof_data[2].n_lock_ops;
  nstime_add(&(pcVar8->astats).mutex_prof_data[3].tot_wait_time,
             &(pcVar7->astats).mutex_prof_data[3].tot_wait_time);
  pnVar19 = &(pcVar8->astats).mutex_prof_data[3].max_wait_time;
  pnVar20 = &(pcVar7->astats).mutex_prof_data[3].max_wait_time;
  iVar13 = nstime_compare(pnVar19,pnVar20);
  if (iVar13 < 0) {
    nstime_copy(pnVar19,pnVar20);
  }
  uVar16 = (pcVar7->astats).mutex_prof_data[3].n_spin_acquired;
  uVar21 = (pcVar8->astats).mutex_prof_data[3].n_spin_acquired;
  (pcVar8->astats).mutex_prof_data[3].n_wait_times =
       (pcVar8->astats).mutex_prof_data[3].n_wait_times +
       (pcVar7->astats).mutex_prof_data[3].n_wait_times;
  (pcVar8->astats).mutex_prof_data[3].n_spin_acquired = uVar21 + uVar16;
  uVar6 = (pcVar7->astats).mutex_prof_data[3].max_n_thds;
  if ((pcVar8->astats).mutex_prof_data[3].max_n_thds < uVar6) {
    (pcVar8->astats).mutex_prof_data[3].max_n_thds = uVar6;
  }
  (pcVar8->astats).mutex_prof_data[3].n_waiting_thds.repr =
       (pcVar7->astats).mutex_prof_data[3].n_waiting_thds.repr +
       (pcVar8->astats).mutex_prof_data[3].n_waiting_thds.repr;
  puVar1 = &(pcVar8->astats).mutex_prof_data[3].n_owner_switches;
  *puVar1 = *puVar1 + (pcVar7->astats).mutex_prof_data[3].n_owner_switches;
  puVar1 = &(pcVar8->astats).mutex_prof_data[3].n_lock_ops;
  *puVar1 = *puVar1 + (pcVar7->astats).mutex_prof_data[3].n_lock_ops;
  nstime_add(&(pcVar8->astats).mutex_prof_data[4].tot_wait_time,
             &(pcVar7->astats).mutex_prof_data[4].tot_wait_time);
  pnVar19 = &(pcVar8->astats).mutex_prof_data[4].max_wait_time;
  pnVar20 = &(pcVar7->astats).mutex_prof_data[4].max_wait_time;
  iVar13 = nstime_compare(pnVar19,pnVar20);
  if (iVar13 < 0) {
    nstime_copy(pnVar19,pnVar20);
  }
  uVar16 = (pcVar7->astats).mutex_prof_data[4].n_spin_acquired;
  uVar21 = (pcVar8->astats).mutex_prof_data[4].n_spin_acquired;
  (pcVar8->astats).mutex_prof_data[4].n_wait_times =
       (pcVar8->astats).mutex_prof_data[4].n_wait_times +
       (pcVar7->astats).mutex_prof_data[4].n_wait_times;
  (pcVar8->astats).mutex_prof_data[4].n_spin_acquired = uVar21 + uVar16;
  uVar6 = (pcVar7->astats).mutex_prof_data[4].max_n_thds;
  if ((pcVar8->astats).mutex_prof_data[4].max_n_thds < uVar6) {
    (pcVar8->astats).mutex_prof_data[4].max_n_thds = uVar6;
  }
  (pcVar8->astats).mutex_prof_data[4].n_waiting_thds.repr =
       (pcVar7->astats).mutex_prof_data[4].n_waiting_thds.repr +
       (pcVar8->astats).mutex_prof_data[4].n_waiting_thds.repr;
  puVar1 = &(pcVar8->astats).mutex_prof_data[4].n_owner_switches;
  *puVar1 = *puVar1 + (pcVar7->astats).mutex_prof_data[4].n_owner_switches;
  puVar1 = &(pcVar8->astats).mutex_prof_data[4].n_lock_ops;
  *puVar1 = *puVar1 + (pcVar7->astats).mutex_prof_data[4].n_lock_ops;
  nstime_add(&(pcVar8->astats).mutex_prof_data[5].tot_wait_time,
             &(pcVar7->astats).mutex_prof_data[5].tot_wait_time);
  pnVar19 = &(pcVar8->astats).mutex_prof_data[5].max_wait_time;
  pnVar20 = &(pcVar7->astats).mutex_prof_data[5].max_wait_time;
  iVar13 = nstime_compare(pnVar19,pnVar20);
  if (iVar13 < 0) {
    nstime_copy(pnVar19,pnVar20);
  }
  uVar16 = (pcVar7->astats).mutex_prof_data[5].n_spin_acquired;
  uVar21 = (pcVar8->astats).mutex_prof_data[5].n_spin_acquired;
  (pcVar8->astats).mutex_prof_data[5].n_wait_times =
       (pcVar8->astats).mutex_prof_data[5].n_wait_times +
       (pcVar7->astats).mutex_prof_data[5].n_wait_times;
  (pcVar8->astats).mutex_prof_data[5].n_spin_acquired = uVar21 + uVar16;
  uVar6 = (pcVar7->astats).mutex_prof_data[5].max_n_thds;
  if ((pcVar8->astats).mutex_prof_data[5].max_n_thds < uVar6) {
    (pcVar8->astats).mutex_prof_data[5].max_n_thds = uVar6;
  }
  (pcVar8->astats).mutex_prof_data[5].n_waiting_thds.repr =
       (pcVar7->astats).mutex_prof_data[5].n_waiting_thds.repr +
       (pcVar8->astats).mutex_prof_data[5].n_waiting_thds.repr;
  puVar1 = &(pcVar8->astats).mutex_prof_data[5].n_owner_switches;
  *puVar1 = *puVar1 + (pcVar7->astats).mutex_prof_data[5].n_owner_switches;
  puVar1 = &(pcVar8->astats).mutex_prof_data[5].n_lock_ops;
  *puVar1 = *puVar1 + (pcVar7->astats).mutex_prof_data[5].n_lock_ops;
  nstime_add(&(pcVar8->astats).mutex_prof_data[6].tot_wait_time,
             &(pcVar7->astats).mutex_prof_data[6].tot_wait_time);
  pnVar19 = &(pcVar8->astats).mutex_prof_data[6].max_wait_time;
  pnVar20 = &(pcVar7->astats).mutex_prof_data[6].max_wait_time;
  iVar13 = nstime_compare(pnVar19,pnVar20);
  if (iVar13 < 0) {
    nstime_copy(pnVar19,pnVar20);
  }
  uVar16 = (pcVar7->astats).mutex_prof_data[6].n_spin_acquired;
  uVar21 = (pcVar8->astats).mutex_prof_data[6].n_spin_acquired;
  (pcVar8->astats).mutex_prof_data[6].n_wait_times =
       (pcVar8->astats).mutex_prof_data[6].n_wait_times +
       (pcVar7->astats).mutex_prof_data[6].n_wait_times;
  (pcVar8->astats).mutex_prof_data[6].n_spin_acquired = uVar21 + uVar16;
  uVar6 = (pcVar7->astats).mutex_prof_data[6].max_n_thds;
  if ((pcVar8->astats).mutex_prof_data[6].max_n_thds < uVar6) {
    (pcVar8->astats).mutex_prof_data[6].max_n_thds = uVar6;
  }
  (pcVar8->astats).mutex_prof_data[6].n_waiting_thds.repr =
       (pcVar7->astats).mutex_prof_data[6].n_waiting_thds.repr +
       (pcVar8->astats).mutex_prof_data[6].n_waiting_thds.repr;
  puVar1 = &(pcVar8->astats).mutex_prof_data[6].n_owner_switches;
  *puVar1 = *puVar1 + (pcVar7->astats).mutex_prof_data[6].n_owner_switches;
  puVar1 = &(pcVar8->astats).mutex_prof_data[6].n_lock_ops;
  *puVar1 = *puVar1 + (pcVar7->astats).mutex_prof_data[6].n_lock_ops;
  nstime_add(&(pcVar8->astats).mutex_prof_data[7].tot_wait_time,
             &(pcVar7->astats).mutex_prof_data[7].tot_wait_time);
  pnVar19 = &(pcVar8->astats).mutex_prof_data[7].max_wait_time;
  pnVar20 = &(pcVar7->astats).mutex_prof_data[7].max_wait_time;
  iVar13 = nstime_compare(pnVar19,pnVar20);
  if (iVar13 < 0) {
    nstime_copy(pnVar19,pnVar20);
  }
  uVar16 = (pcVar7->astats).mutex_prof_data[7].n_spin_acquired;
  uVar21 = (pcVar8->astats).mutex_prof_data[7].n_spin_acquired;
  (pcVar8->astats).mutex_prof_data[7].n_wait_times =
       (pcVar8->astats).mutex_prof_data[7].n_wait_times +
       (pcVar7->astats).mutex_prof_data[7].n_wait_times;
  (pcVar8->astats).mutex_prof_data[7].n_spin_acquired = uVar21 + uVar16;
  uVar6 = (pcVar7->astats).mutex_prof_data[7].max_n_thds;
  if ((pcVar8->astats).mutex_prof_data[7].max_n_thds < uVar6) {
    (pcVar8->astats).mutex_prof_data[7].max_n_thds = uVar6;
  }
  (pcVar8->astats).mutex_prof_data[7].n_waiting_thds.repr =
       (pcVar7->astats).mutex_prof_data[7].n_waiting_thds.repr +
       (pcVar8->astats).mutex_prof_data[7].n_waiting_thds.repr;
  puVar1 = &(pcVar8->astats).mutex_prof_data[7].n_owner_switches;
  *puVar1 = *puVar1 + (pcVar7->astats).mutex_prof_data[7].n_owner_switches;
  puVar1 = &(pcVar8->astats).mutex_prof_data[7].n_lock_ops;
  *puVar1 = *puVar1 + (pcVar7->astats).mutex_prof_data[7].n_lock_ops;
  nstime_add(&(pcVar8->astats).mutex_prof_data[8].tot_wait_time,
             &(pcVar7->astats).mutex_prof_data[8].tot_wait_time);
  pnVar19 = &(pcVar8->astats).mutex_prof_data[8].max_wait_time;
  pnVar20 = &(pcVar7->astats).mutex_prof_data[8].max_wait_time;
  iVar13 = nstime_compare(pnVar19,pnVar20);
  if (iVar13 < 0) {
    nstime_copy(pnVar19,pnVar20);
  }
  uVar16 = (pcVar7->astats).mutex_prof_data[8].n_spin_acquired;
  uVar21 = (pcVar8->astats).mutex_prof_data[8].n_spin_acquired;
  (pcVar8->astats).mutex_prof_data[8].n_wait_times =
       (pcVar8->astats).mutex_prof_data[8].n_wait_times +
       (pcVar7->astats).mutex_prof_data[8].n_wait_times;
  (pcVar8->astats).mutex_prof_data[8].n_spin_acquired = uVar21 + uVar16;
  uVar6 = (pcVar7->astats).mutex_prof_data[8].max_n_thds;
  if ((pcVar8->astats).mutex_prof_data[8].max_n_thds < uVar6) {
    (pcVar8->astats).mutex_prof_data[8].max_n_thds = uVar6;
  }
  (pcVar8->astats).mutex_prof_data[8].n_waiting_thds.repr =
       (pcVar7->astats).mutex_prof_data[8].n_waiting_thds.repr +
       (pcVar8->astats).mutex_prof_data[8].n_waiting_thds.repr;
  puVar1 = &(pcVar8->astats).mutex_prof_data[8].n_owner_switches;
  *puVar1 = *puVar1 + (pcVar7->astats).mutex_prof_data[8].n_owner_switches;
  puVar1 = &(pcVar8->astats).mutex_prof_data[8].n_lock_ops;
  *puVar1 = *puVar1 + (pcVar7->astats).mutex_prof_data[8].n_lock_ops;
  if (!destroyed) {
    (pcVar8->astats).base.repr = (pcVar7->astats).base.repr + (pcVar8->astats).base.repr;
    (pcVar8->astats).internal.repr = (pcVar7->astats).internal.repr + (pcVar8->astats).internal.repr
    ;
    (pcVar8->astats).resident.repr = (pcVar7->astats).resident.repr + (pcVar8->astats).resident.repr
    ;
    (pcVar8->astats).metadata_thp.repr =
         (pcVar7->astats).metadata_thp.repr + (pcVar8->astats).metadata_thp.repr;
    pcVar8->allocated_small = pcVar8->allocated_small + pcVar7->allocated_small;
  }
  uVar16 = pcVar7->ndalloc_small;
  pcVar8->nmalloc_small = pcVar8->nmalloc_small + pcVar7->nmalloc_small;
  pcVar8->ndalloc_small = pcVar8->ndalloc_small + uVar16;
  uVar16 = pcVar7->nfills_small;
  pcVar8->nrequests_small = pcVar7->nrequests_small + pcVar8->nrequests_small;
  pcVar8->nfills_small = uVar16 + pcVar8->nfills_small;
  pcVar8->nflushes_small = pcVar8->nflushes_small + pcVar7->nflushes_small;
  if (!destroyed) {
    (pcVar8->astats).allocated_large.repr =
         (pcVar7->astats).allocated_large.repr + (pcVar8->astats).allocated_large.repr;
  }
  (pcVar8->astats).nmalloc_large.repr =
       (pcVar7->astats).nmalloc_large.repr + (pcVar8->astats).nmalloc_large.repr;
  (pcVar8->astats).ndalloc_large.repr =
       (pcVar7->astats).ndalloc_large.repr + (pcVar8->astats).ndalloc_large.repr;
  (pcVar8->astats).nrequests_large.repr =
       (pcVar7->astats).nrequests_large.repr + (pcVar8->astats).nrequests_large.repr;
  (pcVar8->astats).tcache_bytes.repr =
       (pcVar7->astats).tcache_bytes.repr + (pcVar8->astats).tcache_bytes.repr;
  if (pcVar14->arena_ind == 0) {
    (pcVar8->astats).uptime.ns = (pcVar7->astats).uptime.ns;
  }
  lVar17 = 0;
  do {
    plVar2 = (long *)((long)&pcVar7->bstats[0].nmalloc + lVar17);
    lVar9 = plVar2[1];
    plVar4 = (long *)((long)&pcVar8->bstats[0].nmalloc + lVar17);
    lVar10 = plVar4[1];
    plVar5 = (long *)((long)&pcVar8->bstats[0].nmalloc + lVar17);
    *plVar5 = *plVar4 + *plVar2;
    plVar5[1] = lVar10 + lVar9;
    plVar2 = (long *)((long)&pcVar8->bstats[0].nrequests + lVar17);
    *plVar2 = *plVar2 + *(long *)((long)&pcVar7->bstats[0].nrequests + lVar17);
    if (!destroyed) {
      plVar2 = (long *)((long)&pcVar8->bstats[0].curregs + lVar17);
      *plVar2 = *plVar2 + *(long *)((long)&pcVar7->bstats[0].curregs + lVar17);
    }
    plVar2 = (long *)((long)&pcVar7->bstats[0].nfills + lVar17);
    lVar9 = plVar2[1];
    plVar4 = (long *)((long)&pcVar8->bstats[0].nfills + lVar17);
    lVar10 = plVar4[1];
    plVar5 = (long *)((long)&pcVar8->bstats[0].nslabs + lVar17);
    lVar11 = *plVar5;
    lVar12 = plVar5[1];
    plVar5 = (long *)((long)&pcVar8->bstats[0].nfills + lVar17);
    *plVar5 = *plVar4 + *plVar2;
    plVar5[1] = lVar10 + lVar9;
    plVar2 = (long *)((long)&pcVar7->bstats[0].nslabs + lVar17);
    lVar9 = plVar2[1];
    plVar4 = (long *)((long)&pcVar8->bstats[0].nslabs + lVar17);
    *plVar4 = *plVar2 + lVar11;
    plVar4[1] = lVar9 + lVar12;
    if (!destroyed) {
      plVar2 = (long *)((long)&pcVar7->bstats[0].curslabs + lVar17);
      lVar9 = plVar2[1];
      plVar4 = (long *)((long)&pcVar8->bstats[0].curslabs + lVar17);
      lVar10 = plVar4[1];
      plVar5 = (long *)((long)&pcVar8->bstats[0].curslabs + lVar17);
      *plVar5 = *plVar4 + *plVar2;
      plVar5[1] = lVar10 + lVar9;
    }
    nstime_add((nstime_t *)((long)&pcVar8->bstats[0].mutex_data.tot_wait_time.ns + lVar17),
               (nstime_t *)((long)&pcVar7->bstats[0].mutex_data.tot_wait_time.ns + lVar17));
    pnVar19 = (nstime_t *)((long)&pcVar8->bstats[0].mutex_data.max_wait_time.ns + lVar17);
    pnVar20 = (nstime_t *)((long)&pcVar7->bstats[0].mutex_data.max_wait_time.ns + lVar17);
    iVar13 = nstime_compare(pnVar19,pnVar20);
    if (iVar13 < 0) {
      nstime_copy(pnVar19,pnVar20);
    }
    plVar2 = (long *)((long)&pcVar7->bstats[0].mutex_data.n_wait_times + lVar17);
    lVar9 = plVar2[1];
    plVar4 = (long *)((long)&pcVar8->bstats[0].mutex_data.n_wait_times + lVar17);
    lVar10 = plVar4[1];
    plVar5 = (long *)((long)&pcVar8->bstats[0].mutex_data.n_wait_times + lVar17);
    *plVar5 = *plVar4 + *plVar2;
    plVar5[1] = lVar10 + lVar9;
    uVar6 = *(uint *)((long)&pcVar7->bstats[0].mutex_data.max_n_thds + lVar17);
    if (*(uint *)((long)&pcVar8->bstats[0].mutex_data.max_n_thds + lVar17) < uVar6) {
      *(uint *)((long)&pcVar8->bstats[0].mutex_data.max_n_thds + lVar17) = uVar6;
    }
    *(int *)((long)&pcVar8->bstats[0].mutex_data.n_waiting_thds.repr + lVar17) =
         *(int *)((long)&pcVar7->bstats[0].mutex_data.n_waiting_thds.repr + lVar17) +
         *(int *)((long)&pcVar8->bstats[0].mutex_data.n_waiting_thds.repr + lVar17);
    plVar2 = (long *)((long)&pcVar8->bstats[0].mutex_data.n_owner_switches + lVar17);
    *plVar2 = *plVar2 + *(long *)((long)&pcVar7->bstats[0].mutex_data.n_owner_switches + lVar17);
    plVar2 = (long *)((long)&pcVar8->bstats[0].mutex_data.n_lock_ops + lVar17);
    *plVar2 = *plVar2 + *(long *)((long)&pcVar7->bstats[0].mutex_data.n_lock_ops + lVar17);
    lVar17 = lVar17 + 0x90;
  } while (lVar17 != 0x1440);
  lVar17 = 0;
  do {
    *(long *)((long)&pcVar8->lstats[0].nmalloc.repr + lVar17) =
         *(long *)((long)&pcVar7->lstats[0].nmalloc.repr + lVar17) +
         *(long *)((long)&pcVar8->lstats[0].nmalloc.repr + lVar17);
    *(long *)((long)&pcVar8->lstats[0].ndalloc.repr + lVar17) =
         *(long *)((long)&pcVar7->lstats[0].ndalloc.repr + lVar17) +
         *(long *)((long)&pcVar8->lstats[0].ndalloc.repr + lVar17);
    *(long *)((long)&pcVar8->lstats[0].nrequests.repr + lVar17) =
         *(long *)((long)&pcVar7->lstats[0].nrequests.repr + lVar17) +
         *(long *)((long)&pcVar8->lstats[0].nrequests.repr + lVar17);
    if (!destroyed) {
      plVar2 = (long *)((long)&pcVar8->lstats[0].curlextents + lVar17);
      *plVar2 = *plVar2 + *(long *)((long)&pcVar7->lstats[0].curlextents + lVar17);
    }
    lVar17 = lVar17 + 0x30;
  } while (lVar17 != 0x24c0);
  lVar17 = 0;
  do {
    *(long *)((long)&pcVar8->estats[0].ndirty.repr + lVar17) =
         *(long *)((long)&pcVar7->estats[0].ndirty.repr + lVar17) +
         *(long *)((long)&pcVar8->estats[0].ndirty.repr + lVar17);
    *(long *)((long)&pcVar8->estats[0].nmuzzy.repr + lVar17) =
         *(long *)((long)&pcVar7->estats[0].nmuzzy.repr + lVar17) +
         *(long *)((long)&pcVar8->estats[0].nmuzzy.repr + lVar17);
    *(long *)((long)&pcVar8->estats[0].nretained.repr + lVar17) =
         *(long *)((long)&pcVar7->estats[0].nretained.repr + lVar17) +
         *(long *)((long)&pcVar8->estats[0].nretained.repr + lVar17);
    *(long *)((long)&pcVar8->estats[0].dirty_bytes.repr + lVar17) =
         *(long *)((long)&pcVar7->estats[0].dirty_bytes.repr + lVar17) +
         *(long *)((long)&pcVar8->estats[0].dirty_bytes.repr + lVar17);
    *(long *)((long)&pcVar8->estats[0].muzzy_bytes.repr + lVar17) =
         *(long *)((long)&pcVar7->estats[0].muzzy_bytes.repr + lVar17) +
         *(long *)((long)&pcVar8->estats[0].muzzy_bytes.repr + lVar17);
    *(long *)((long)&pcVar8->estats[0].retained_bytes.repr + lVar17) =
         *(long *)((long)&pcVar7->estats[0].retained_bytes.repr + lVar17) +
         *(long *)((long)&pcVar8->estats[0].retained_bytes.repr + lVar17);
    lVar17 = lVar17 + 0x30;
  } while (lVar17 != 0x2550);
  return;
}

Assistant:

static void
ctl_arena_refresh(tsdn_t *tsdn, arena_t *arena, ctl_arena_t *ctl_sdarena,
    unsigned i, bool destroyed) {
	ctl_arena_t *ctl_arena = arenas_i(i);

	ctl_arena_clear(ctl_arena);
	ctl_arena_stats_amerge(tsdn, ctl_arena, arena);
	/* Merge into sum stats as well. */
	ctl_arena_stats_sdmerge(ctl_sdarena, ctl_arena, destroyed);
}